

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::ResetAllocation(InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
                  *this,Allocation new_allocation,size_type new_size)

{
  bool bVar1;
  iterator pQVar2;
  Allocation *pAVar3;
  allocator_type *a;
  pointer pQVar4;
  pointer pQVar5;
  size_type sVar6;
  Tag *this_00;
  size_type new_size_local;
  InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
  *this_local;
  Allocation new_allocation_local;
  
  new_allocation_local.capacity_ = (size_type)new_allocation.buffer_;
  this_local = (InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
                *)new_allocation.capacity_;
  bVar1 = allocated(this);
  if (bVar1) {
    pQVar4 = allocated_space(this);
    pQVar5 = allocated_space(this);
    sVar6 = size(this);
    Destroy(this,pQVar4,pQVar5 + sVar6);
    pQVar2 = begin(this);
    pQVar4 = allocated_space(this);
    if (pQVar2 != pQVar4) {
      __assert_fail("begin() == allocated_space()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                    ,0x31b,
                    "void absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::ResetAllocation(Allocation, size_type) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
                   );
    }
    pAVar3 = allocation(this);
    a = allocator(this);
    Allocation::Dealloc(pAVar3,a);
    pAVar3 = allocation(this);
    pAVar3->capacity_ = (size_type)this_local;
    pAVar3->buffer_ = (pointer)new_allocation_local.capacity_;
  }
  else {
    pQVar4 = inlined_space(this);
    pQVar5 = inlined_space(this);
    sVar6 = size(this);
    Destroy(this,pQVar4,pQVar5 + sVar6);
    init_allocation(this,(Allocation *)&this_local);
  }
  this_00 = tag(this);
  Tag::set_allocated_size(this_00,new_size);
  return;
}

Assistant:

void ResetAllocation(Allocation new_allocation, size_type new_size) {
    if (allocated()) {
      Destroy(allocated_space(), allocated_space() + size());
      assert(begin() == allocated_space());
      allocation().Dealloc(allocator());
      allocation() = new_allocation;
    } else {
      Destroy(inlined_space(), inlined_space() + size());
      init_allocation(new_allocation);  // bug: only init once
    }
    tag().set_allocated_size(new_size);
  }